

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O1

errno_t wcsncpy_s(WCHAR *_Dst,size_t _SizeInWords,WCHAR *_Src,size_t _Count)

{
  short sVar1;
  ulong uVar2;
  size_t __n;
  errno_t eVar3;
  size_t sVar4;
  WCHAR *__s;
  long lVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  
  eVar3 = 0;
  if ((_Count == 0 && _SizeInWords == 0) && _Dst == (WCHAR *)0x0) {
    return 0;
  }
  if (_Dst == (WCHAR *)0x0 || _SizeInWords == 0) {
LAB_003641a7:
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    eVar3 = 0x16;
  }
  else {
    if (_Count == 0) {
      *_Dst = L'\0';
      if (_SizeInWords < 2) {
        return 0;
      }
      __s = _Dst + 1;
      __n = _SizeInWords * 2 - 2;
    }
    else {
      if (_Src == (WCHAR *)0x0) {
        *_Dst = L'\0';
        if (1 < _SizeInWords) {
          memset(_Dst + 1,0xfd,_SizeInWords * 2 - 2);
        }
        goto LAB_003641a7;
      }
      sVar7 = _SizeInWords;
      if (_Count == 0xffffffffffffffff) {
        lVar6 = 0;
        do {
          sVar1 = *(short *)((long)_Src + lVar6);
          *(short *)((long)_Dst + lVar6) = sVar1;
          if (sVar1 == 0) goto LAB_003642ac;
          lVar6 = lVar6 + 2;
          sVar7 = sVar7 - 1;
        } while (sVar7 != 0);
        sVar7 = 0;
      }
      else {
        lVar5 = _Count - _SizeInWords;
        sVar4 = _SizeInWords - _Count;
        lVar6 = 0;
        do {
          lVar8 = lVar6;
          sVar1 = *(short *)((long)_Src + lVar8);
          *(short *)((long)_Dst + lVar8) = sVar1;
          if (sVar1 == 0) goto LAB_00364298;
          if (sVar7 == 1) {
            sVar7 = 0;
            _Count = lVar5 + 1;
            goto LAB_00364298;
          }
          sVar7 = sVar7 - 1;
          _Count = _Count - 1;
          lVar6 = lVar8 + 2;
        } while (_Count != 0);
        sVar7 = sVar4;
        _Count = 0;
LAB_00364298:
        if (_Count == 0) {
          *(undefined2 *)((long)_Dst + lVar8 + 2) = 0;
          _Count = 0;
        }
      }
LAB_003642ac:
      if (sVar7 == 0) {
        if (_Count != 0xffffffffffffffff) {
          *_Dst = L'\0';
          if (1 < _SizeInWords) {
            memset(_Dst + 1,0xfd,_SizeInWords * 2 - 2);
          }
          RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
          return 0x22;
        }
        _Dst[_SizeInWords - 1] = L'\0';
        return 0x50;
      }
      uVar2 = (_SizeInWords - sVar7) + 1;
      if (_SizeInWords < uVar2 || _SizeInWords - uVar2 == 0) {
        return 0;
      }
      __s = _Dst + uVar2;
      __n = (_SizeInWords - uVar2) * 2;
    }
    memset(__s,0xfd,__n);
  }
  return eVar3;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl wcsncpy_s(WCHAR *_Dst, size_t _SizeInWords, const WCHAR *_Src, size_t _Count)
{
    WCHAR *p;
    size_t available;

    if (_Count == 0 && _Dst == nullptr && _SizeInWords == 0)
    {
        /* this case is allowed; nothing to do */
        return 0;
    }

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInWords);
    if (_Count == 0)
    {
        /* notice that the source string pointer can be nullptr in this case */
        _SAFECRT__RESET_STRING(_Dst, _SizeInWords);
        return 0;
    }
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInWords);

    p = _Dst;
    available = _SizeInWords;
    if (_Count == _TRUNCATE)
    {
        while ((*p++ = *_Src++) != 0 && --available > 0)
        {
        }
    }
    else
    {
        while ((*p++ = *_Src++) != 0 && --available > 0 && --_Count > 0)
        {
        }
        if (_Count == 0)
        {
            *p = 0;
        }
    }

    if (available == 0)
    {
        if (_Count == _TRUNCATE)
        {
            _Dst[_SizeInWords - 1] = 0;
            return STRUNCATE;
        }
        _SAFECRT__RESET_STRING(_Dst, _SizeInWords);
        _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInWords);
    }
    _SAFECRT__FILL_STRING(_Dst, _SizeInWords, _SizeInWords - available + 1);
    return 0;
}